

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void BoostLexicalCastOnStack<unsigned_short>(void)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  ostream *poVar5;
  type tVar6;
  char *tmp_finish;
  char *pcVar7;
  undefined8 local_70;
  undefined8 local_68;
  type_info_t *local_60;
  char *local_58;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_short,_char> local_50;
  long local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  pcVar7 = _endl<char,std::char_traits<char>> + (*_endl<char,std::char_traits<char>> == '*');
  sVar2 = strlen(pcVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"boost::lexical_cast on stack",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  local_38 = std::chrono::_V2::steady_clock::now();
  tVar6 = 0;
  pcVar7 = (char *)((long)&local_68 + 4);
  do {
    local_50.m_czero = '0';
    local_50.m_zero = 0x30;
    local_60 = (type_info_t *)((long)&local_70 + 2);
    local_58 = pcVar7;
    local_50.m_value = tVar6;
    local_50.m_finish = pcVar7;
    pcVar3 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_short,_char>::
             convert(&local_50);
    if (0x3f < (ulong)((long)pcVar7 - (long)pcVar3)) {
      local_70 = &PTR__bad_cast_0010fd30;
      local_68 = (type_info_t *)&unsigned_short::typeinfo;
      local_60 = (type_info_t *)&std::array<char,64ul>::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_70);
    }
    tVar6 = tVar6 + 1;
  } while (tVar6 != 0xffff);
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - local_38) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void BoostLexicalCastOnStack()
{
    typedef std::array<char, 64> buf_t;
    PROFILING_BEGIN(T, "boost::lexical_cast on stack")
    buf_t buf = boost::lexical_cast<buf_t>(i);
    PROFILING_END()
}